

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::ClearDependencyInformation(cmTarget *this,cmMakefile *mf)

{
  string *str;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  undefined1 local_38 [8];
  string depname;
  cmMakefile *mf_local;
  cmTarget *this_local;
  
  depname.field_2._8_8_ = mf;
  str = GetName_abi_cxx11_(this);
  cmAlphaNum::cmAlphaNum(&local_68,str);
  cmAlphaNum::cmAlphaNum(&local_98,"_LIB_DEPENDS");
  cmStrCat<>((string *)local_38,&local_68,&local_98);
  cmMakefile::RemoveCacheDefinition((cmMakefile *)depname.field_2._8_8_,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmTarget::ClearDependencyInformation(cmMakefile& mf) const
{
  std::string depname = cmStrCat(this->GetName(), "_LIB_DEPENDS");
  mf.RemoveCacheDefinition(depname);
}